

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall
V2Chan::accumulate(V2Chan *this,StereoSample *dest,StereoSample *src,int nsamples,float gain)

{
  int local_2c;
  int i;
  float gain_local;
  int nsamples_local;
  StereoSample *src_local;
  StereoSample *dest_local;
  V2Chan *this_local;
  
  if ((gain != 0.0) || (NAN(gain))) {
    for (local_2c = 0; local_2c < nsamples; local_2c = local_2c + 1) {
      dest[local_2c].field_0.l = gain * src[local_2c].field_0.l + dest[local_2c].field_0.l;
      *(float *)((long)dest + (long)local_2c * 8 + 4) =
           gain * *(float *)((long)src + (long)local_2c * 8 + 4) +
           *(float *)((long)dest + (long)local_2c * 8 + 4);
    }
  }
  return;
}

Assistant:

void accumulate(StereoSample *dest, const StereoSample *src, int nsamples, float gain)
    {
        if (gain == 0.0f)
            return;

        for (int i = 0; i < nsamples; i++)
        {
            dest[i].l += gain * src[i].l;
            dest[i].r += gain * src[i].r;
        }
    }